

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_key.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  mbedtls_pk_type_t mVar2;
  mbedtls_ecp_curve_info *pmVar3;
  char *pcVar4;
  size_t len;
  mbedtls_pk_info_t *info;
  mbedtls_rsa_context *pmVar5;
  mbedtls_ecp_keypair *pmVar6;
  char *__nptr;
  mbedtls_ecp_keypair *ecp;
  mbedtls_rsa_context *rsa;
  mbedtls_ecp_curve_info *curve_info;
  char *pers;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  char *q;
  char *p;
  char local_438 [4];
  int i;
  char buf [1024];
  undefined1 local_30 [8];
  mbedtls_pk_context key;
  int exit_code;
  int ret;
  char **argv_local;
  int argc_local;
  
  key.pk_ctx._4_4_ = 1;
  key.pk_ctx._0_4_ = 1;
  mbedtls_mpi_init((mbedtls_mpi *)&P.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_init((mbedtls_mpi *)&D.p);
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DP.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DQ.p);
  mbedtls_mpi_init((mbedtls_mpi *)&QP.p);
  mbedtls_mpi_init((mbedtls_mpi *)&entropy.source[0x13].strong);
  mbedtls_pk_init((mbedtls_pk_context *)local_30);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&pers);
  memset(local_438,0,0x400);
  if (argc == 0) {
LAB_001094d5:
    printf(
          "\n usage: gen_key param=<>...\n\n acceptable parameters:\n    type=rsa|ec           default: rsa\n    rsa_keysize=%%d        default: 4096\n    ec_curve=%%s           see below\n    filename=%%s           default: keyfile.key\n    format=pem|der        default: pem\n    use_dev_random=0|1    default: 0\n\n"
          );
    printf(" available ec_curve values:\n");
    rsa = (mbedtls_rsa_context *)mbedtls_ecp_curve_list();
    printf("    %s (default)\n",(char *)rsa->len);
    while ((rsa->N).n != 0) {
      printf("    %s\n",(rsa->N).n);
      rsa = (mbedtls_rsa_context *)&rsa->N;
    }
  }
  else {
    opt.type = 1;
    opt.rsa_keysize = 0x1000;
    pmVar3 = mbedtls_ecp_curve_list();
    opt.ec_curve = pmVar3->grp_id;
    opt.filename = "keyfile.key";
    opt.format = 0;
    opt.use_dev_random = 0;
    for (p._4_4_ = 1; p._4_4_ < argc; p._4_4_ = p._4_4_ + 1) {
      __s = argv[p._4_4_];
      pcVar4 = strchr(__s,0x3d);
      if (pcVar4 == (char *)0x0) goto LAB_001094d5;
      __nptr = pcVar4 + 1;
      *pcVar4 = '\0';
      iVar1 = strcmp(__s,"type");
      if (iVar1 == 0) {
        iVar1 = strcmp(__nptr,"rsa");
        if (iVar1 == 0) {
          opt.type = 1;
          __nptr = opt.filename;
        }
        else {
          iVar1 = strcmp(__nptr,"ec");
          if (iVar1 != 0) goto LAB_001094d5;
          opt.type = 2;
          __nptr = opt.filename;
        }
      }
      else {
        iVar1 = strcmp(__s,"format");
        if (iVar1 == 0) {
          iVar1 = strcmp(__nptr,"pem");
          if (iVar1 == 0) {
            opt.format = 0;
            __nptr = opt.filename;
          }
          else {
            iVar1 = strcmp(__nptr,"der");
            if (iVar1 != 0) goto LAB_001094d5;
            opt.format = 1;
            __nptr = opt.filename;
          }
        }
        else {
          iVar1 = strcmp(__s,"rsa_keysize");
          if (iVar1 == 0) {
            opt.rsa_keysize = atoi(__nptr);
            if ((opt.rsa_keysize < 0x400) || (__nptr = opt.filename, 0x2000 < opt.rsa_keysize))
            goto LAB_001094d5;
          }
          else {
            iVar1 = strcmp(__s,"ec_curve");
            if (iVar1 == 0) {
              pmVar3 = mbedtls_ecp_curve_info_from_name(__nptr);
              if (pmVar3 == (mbedtls_ecp_curve_info *)0x0) goto LAB_001094d5;
              opt.ec_curve = pmVar3->grp_id;
              __nptr = opt.filename;
            }
            else {
              iVar1 = strcmp(__s,"filename");
              if ((iVar1 != 0) &&
                 (((iVar1 = strcmp(__s,"use_dev_random"), iVar1 != 0 ||
                   (opt.use_dev_random = atoi(__nptr), opt.use_dev_random < 0)) ||
                  (__nptr = opt.filename, 1 < opt.use_dev_random)))) goto LAB_001094d5;
            }
          }
        }
      }
      opt.filename = __nptr;
    }
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
    if (opt.use_dev_random != 0) {
      key.pk_ctx._4_4_ =
           mbedtls_entropy_add_source
                     ((mbedtls_entropy_context *)&ctr_drbg.p_entropy,dev_random_entropy_poll,
                      (void *)0x0,0x20,1);
      if (key.pk_ctx._4_4_ != 0) {
        printf(" failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n",
               (ulong)(uint)-key.pk_ctx._4_4_);
        goto LAB_00109caa;
      }
      printf("\n    Using /dev/random, so can take a long time! ");
      fflush(_stdout);
    }
    len = strlen("gen_key");
    key.pk_ctx._4_4_ =
         mbedtls_ctr_drbg_seed
                   ((mbedtls_ctr_drbg_context *)&pers,mbedtls_entropy_func,&ctr_drbg.p_entropy,
                    (uchar *)"gen_key",len);
    if (key.pk_ctx._4_4_ == 0) {
      printf("\n  . Generating the private key ...");
      fflush(_stdout);
      info = mbedtls_pk_info_from_type(opt.type);
      key.pk_ctx._4_4_ = mbedtls_pk_setup((mbedtls_pk_context *)local_30,info);
      iVar1 = opt.ec_curve;
      if (key.pk_ctx._4_4_ == 0) {
        if (opt.type == 1) {
          pmVar5 = mbedtls_pk_rsa(_local_30);
          key.pk_ctx._4_4_ =
               mbedtls_rsa_gen_key(pmVar5,mbedtls_ctr_drbg_random,&pers,opt.rsa_keysize,0x10001);
          if (key.pk_ctx._4_4_ != 0) {
            printf(" failed\n  !  mbedtls_rsa_gen_key returned -0x%04x",
                   (ulong)(uint)-key.pk_ctx._4_4_);
            goto LAB_00109caa;
          }
        }
        else {
          if (opt.type != 2) {
            printf(" failed\n  !  key type not supported\n");
            goto LAB_00109caa;
          }
          pmVar6 = mbedtls_pk_ec(_local_30);
          key.pk_ctx._4_4_ = mbedtls_ecp_gen_key(iVar1,pmVar6,mbedtls_ctr_drbg_random,&pers);
          if (key.pk_ctx._4_4_ != 0) {
            printf(" failed\n  !  mbedtls_ecp_gen_key returned -0x%04x",
                   (ulong)(uint)-key.pk_ctx._4_4_);
            goto LAB_00109caa;
          }
        }
        key.pk_ctx._4_4_ = 0;
        printf(" ok\n  . Key information:\n");
        mVar2 = mbedtls_pk_get_type((mbedtls_pk_context *)local_30);
        if (mVar2 == MBEDTLS_PK_RSA) {
          pmVar5 = mbedtls_pk_rsa(_local_30);
          key.pk_ctx._4_4_ =
               mbedtls_rsa_export(pmVar5,(mbedtls_mpi *)&P.p,(mbedtls_mpi *)&Q.p,(mbedtls_mpi *)&D.p
                                  ,(mbedtls_mpi *)&E.p,(mbedtls_mpi *)&DP.p);
          if ((key.pk_ctx._4_4_ != 0) ||
             (key.pk_ctx._4_4_ =
                   mbedtls_rsa_export_crt
                             (pmVar5,(mbedtls_mpi *)&DQ.p,(mbedtls_mpi *)&QP.p,
                              (mbedtls_mpi *)&entropy.source[0x13].strong), key.pk_ctx._4_4_ != 0))
          {
            printf(" failed\n  ! could not export RSA parameters\n\n");
            goto LAB_00109caa;
          }
          mbedtls_mpi_write_file("N:  ",(mbedtls_mpi *)&P.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("E:  ",(mbedtls_mpi *)&DP.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("D:  ",(mbedtls_mpi *)&E.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("P:  ",(mbedtls_mpi *)&Q.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("Q:  ",(mbedtls_mpi *)&D.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("DP: ",(mbedtls_mpi *)&DQ.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file("DQ:  ",(mbedtls_mpi *)&QP.p,0x10,(FILE *)0x0);
          mbedtls_mpi_write_file
                    ("QP:  ",(mbedtls_mpi *)&entropy.source[0x13].strong,0x10,(FILE *)0x0);
        }
        else {
          mVar2 = mbedtls_pk_get_type((mbedtls_pk_context *)local_30);
          if (mVar2 == MBEDTLS_PK_ECKEY) {
            pmVar6 = mbedtls_pk_ec(_local_30);
            pmVar3 = mbedtls_ecp_curve_info_from_grp_id((pmVar6->grp).id);
            printf("curve: %s\n",pmVar3->name);
            mbedtls_mpi_write_file("X_Q:   ",&(pmVar6->Q).X,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("Y_Q:   ",&(pmVar6->Q).Y,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("D:     ",&pmVar6->d,0x10,(FILE *)0x0);
          }
          else {
            printf("  ! key type not supported\n");
          }
        }
        printf("  . Writing key to file...");
        key.pk_ctx._4_4_ = write_private_key((mbedtls_pk_context *)local_30,opt.filename);
        if (key.pk_ctx._4_4_ == 0) {
          printf(" ok\n");
          key.pk_ctx._0_4_ = 0;
        }
        else {
          printf(" failed\n");
        }
      }
      else {
        printf(" failed\n  !  mbedtls_pk_setup returned -0x%04x",(ulong)(uint)-key.pk_ctx._4_4_);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n",(ulong)(uint)-key.pk_ctx._4_4_)
      ;
    }
  }
LAB_00109caa:
  if ((int)key.pk_ctx != 0) {
    mbedtls_strerror(key.pk_ctx._4_4_,local_438,0x400);
    printf(" - %s\n",local_438);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&P.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_free((mbedtls_mpi *)&D.p);
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DP.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DQ.p);
  mbedtls_mpi_free((mbedtls_mpi *)&QP.p);
  mbedtls_mpi_free((mbedtls_mpi *)&entropy.source[0x13].strong);
  mbedtls_pk_free((mbedtls_pk_context *)local_30);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&pers);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return (int)key.pk_ctx;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_pk_context key;
    char buf[1024];
    int i;
    char *p, *q;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "gen_key";
#if defined(MBEDTLS_ECP_C)
    const mbedtls_ecp_curve_info *curve_info;
#endif

    /*
     * Set to sane values
     */

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_pk_init( &key );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    memset( buf, 0, sizeof( buf ) );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
#if defined(MBEDTLS_ECP_C)
        mbedtls_printf( " available ec_curve values:\n" );
        curve_info = mbedtls_ecp_curve_list();
        mbedtls_printf( "    %s (default)\n", curve_info->name );
        while( ( ++curve_info )->name != NULL )
            mbedtls_printf( "    %s\n", curve_info->name );
#endif /* MBEDTLS_ECP_C */
        goto exit;
    }

    opt.type                = DFL_TYPE;
    opt.rsa_keysize         = DFL_RSA_KEYSIZE;
    opt.ec_curve            = DFL_EC_CURVE;
    opt.filename            = DFL_FILENAME;
    opt.format              = DFL_FORMAT;
    opt.use_dev_random      = DFL_USE_DEV_RANDOM;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "type" ) == 0 )
        {
            if( strcmp( q, "rsa" ) == 0 )
                opt.type = MBEDTLS_PK_RSA;
            else if( strcmp( q, "ec" ) == 0 )
                opt.type = MBEDTLS_PK_ECKEY;
            else
                goto usage;
        }
        else if( strcmp( p, "format" ) == 0 )
        {
            if( strcmp( q, "pem" ) == 0 )
                opt.format = FORMAT_PEM;
            else if( strcmp( q, "der" ) == 0 )
                opt.format = FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "rsa_keysize" ) == 0 )
        {
            opt.rsa_keysize = atoi( q );
            if( opt.rsa_keysize < 1024 ||
                opt.rsa_keysize > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
#if defined(MBEDTLS_ECP_C)
        else if( strcmp( p, "ec_curve" ) == 0 )
        {
            if( ( curve_info = mbedtls_ecp_curve_info_from_name( q ) ) == NULL )
                goto usage;
            opt.ec_curve = curve_info->grp_id;
        }
#endif
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "use_dev_random" ) == 0 )
        {
            opt.use_dev_random = atoi( q );
            if( opt.use_dev_random < 0 || opt.use_dev_random > 1 )
                goto usage;
        }
        else
            goto usage;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
#if !defined(_WIN32) && defined(MBEDTLS_FS_IO)
    if( opt.use_dev_random )
    {
        if( ( ret = mbedtls_entropy_add_source( &entropy, dev_random_entropy_poll,
                                        NULL, DEV_RANDOM_THRESHOLD,
                                        MBEDTLS_ENTROPY_SOURCE_STRONG ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n", -ret );
            goto exit;
        }

        mbedtls_printf("\n    Using /dev/random, so can take a long time! " );
        fflush( stdout );
    }
#endif /* !_WIN32 && MBEDTLS_FS_IO */

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * 1.1. Generate the key
     */
    mbedtls_printf( "\n  . Generating the private key ..." );
    fflush( stdout );

    if( ( ret = mbedtls_pk_setup( &key,
            mbedtls_pk_info_from_type( (mbedtls_pk_type_t) opt.type ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_pk_setup returned -0x%04x", -ret );
        goto exit;
    }

#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_GENPRIME)
    if( opt.type == MBEDTLS_PK_RSA )
    {
        ret = mbedtls_rsa_gen_key( mbedtls_pk_rsa( key ), mbedtls_ctr_drbg_random, &ctr_drbg,
                                   opt.rsa_keysize, 65537 );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( opt.type == MBEDTLS_PK_ECKEY )
    {
        ret = mbedtls_ecp_gen_key( (mbedtls_ecp_group_id) opt.ec_curve,
                                   mbedtls_pk_ec( key ),
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_ECP_C */
    {
        mbedtls_printf( " failed\n  !  key type not supported\n" );
        goto exit;
    }

    /*
     * 1.2 Print the key
     */
    mbedtls_printf( " ok\n  . Key information:\n" );

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

        if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
            ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
        {
            mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
            goto exit;
        }

        mbedtls_mpi_write_file( "N:  ",  &N,  16, NULL );
        mbedtls_mpi_write_file( "E:  ",  &E,  16, NULL );
        mbedtls_mpi_write_file( "D:  ",  &D,  16, NULL );
        mbedtls_mpi_write_file( "P:  ",  &P,  16, NULL );
        mbedtls_mpi_write_file( "Q:  ",  &Q,  16, NULL );
        mbedtls_mpi_write_file( "DP: ",  &DP, 16, NULL );
        mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL );
        mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL );
    }
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
        mbedtls_printf( "curve: %s\n",
                mbedtls_ecp_curve_info_from_grp_id( ecp->grp.id )->name );
        mbedtls_mpi_write_file( "X_Q:   ", &ecp->Q.X, 16, NULL );
        mbedtls_mpi_write_file( "Y_Q:   ", &ecp->Q.Y, 16, NULL );
        mbedtls_mpi_write_file( "D:     ", &ecp->d  , 16, NULL );
    }
    else
#endif
        mbedtls_printf("  ! key type not supported\n");

    /*
     * 1.3 Export key
     */
    mbedtls_printf( "  . Writing key to file..." );

    if( ( ret = write_private_key( &key, opt.filename ) ) != 0 )
    {
        mbedtls_printf( " failed\n" );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

    mbedtls_pk_free( &key );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}